

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_string(lua_State *L)

{
  ulong lenx;
  TValue *L_00;
  GCstr *pGVar1;
  char *in_RDI;
  size_t len;
  char *p;
  TValue *o;
  CTState *cts;
  CTState *cts_1;
  int in_stack_ffffffffffffff3c;
  lua_State *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  int narg;
  lua_State *in_stack_ffffffffffffff50;
  char *local_a8;
  lua_State *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff88;
  CTInfo flags;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint8_t *in_stack_ffffffffffffff98;
  CType *in_stack_ffffffffffffffa0;
  CTState *in_stack_ffffffffffffffa8;
  
  flags = (CTInfo)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  narg = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  lenx = (ulong)*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0xfc);
  *(char **)(lenx + 0x10) = in_RDI;
  L_00 = lj_lib_checkany(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  if ((L_00 + 1 < *(TValue **)(in_RDI + 0x18)) && (*(int *)((long)L_00 + 0xc) != -1)) {
    ffi_checkint(in_stack_ffffffffffffff50,narg);
    lj_cconv_ct_tv(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   (TValue *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),flags);
  }
  else {
    lj_cconv_ct_tv(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   (TValue *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),flags);
    strlen(local_a8);
  }
  *(TValue **)(in_RDI + 0x18) = L_00 + 1;
  pGVar1 = lj_str_new(in_stack_ffffffffffffff78,in_RDI,lenx);
  (L_00->u32).lo = (uint32_t)pGVar1;
  (L_00->field_2).it = 0xfffffffb;
  if (*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x24) <=
      *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x20)) {
    lj_gc_step((lua_State *)&L_00->field_2);
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_string)	LJLIB_REC(.)
{
  CTState *cts = ctype_cts(L);
  TValue *o = lj_lib_checkany(L, 1);
  const char *p;
  size_t len;
  if (o+1 < L->top && !tvisnil(o+1)) {
    len = (size_t)ffi_checkint(L, 2);
    lj_cconv_ct_tv(cts, ctype_get(cts, CTID_P_CVOID), (uint8_t *)&p, o,
		   CCF_ARG(1));
  } else {
    lj_cconv_ct_tv(cts, ctype_get(cts, CTID_P_CCHAR), (uint8_t *)&p, o,
		   CCF_ARG(1));
    len = strlen(p);
  }
  L->top = o+1;  /* Make sure this is the last item on the stack. */
  setstrV(L, o, lj_str_new(L, p, len));
  lj_gc_check(L);
  return 1;
}